

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

HighsInt __thiscall
HighsOrbitopeMatrix::orbitalFixingForFullOrbitope
          (HighsOrbitopeMatrix *this,vector<int,_std::allocator<int>_> *rows,HighsDomain *domain)

{
  double *pdVar1;
  bool bVar2;
  pointer pcVar3;
  char cVar4;
  byte bVar5;
  char *__dest;
  long lVar6;
  long lVar7;
  HighsInt HVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  char *pcVar24;
  long lVar25;
  double dVar26;
  HighsDomainChange boundchg;
  vector<signed_char,_std::allocator<signed_char>_> Mminimal;
  allocator_type local_82;
  value_type local_81;
  ulong local_80;
  char *local_78;
  long local_70;
  vector<int,_std::allocator<int>_> *local_68;
  ulong local_60;
  vector<signed_char,_std::allocator<signed_char>_> local_58;
  long local_40;
  long local_38;
  
  uVar21 = (ulong)((long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  uVar20 = (uint)uVar21;
  local_81 = -1;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&local_58,(long)(int)uVar20 * (long)this->rowLength,&local_81,&local_82);
  iVar15 = this->rowLength;
  if (0 < iVar15) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (0 < (int)uVar20) {
        uVar13 = 0;
        do {
          iVar15 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(long)this->numRows * (long)(int)lVar7 +
                    (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar13]];
          dVar26 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar15];
          cVar4 = '\x01';
          if ((dVar26 != 1.0) || (NAN(dVar26))) {
            dVar26 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar15];
            if ((dVar26 == 0.0) && (!NAN(dVar26))) {
              cVar4 = '\0';
              goto LAB_002f9035;
            }
          }
          else {
LAB_002f9035:
            local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13 + lVar6] = cVar4;
          }
          uVar13 = uVar13 + 1;
        } while ((uVar21 & 0xffffffff) != uVar13);
        iVar15 = this->rowLength;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + (uVar21 & 0xffffffff);
    } while (lVar7 < iVar15);
  }
  uVar13 = (long)local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar13 == 0) {
    __dest = (char *)0x0;
  }
  else {
    if ((long)uVar13 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (char *)operator_new(uVar13);
  }
  pcVar3 = local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(__dest,local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
            (long)local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
  iVar15 = this->rowLength;
  if (0 < (int)uVar20) {
    iVar15 = (iVar15 + -1) * uVar20;
    uVar13 = 0;
    do {
      if (pcVar3[uVar13 + (long)iVar15] == -1) {
        pcVar3[uVar13 + (long)iVar15] = '\0';
      }
      if (__dest[uVar13] == -1) {
        __dest[uVar13] = '\x01';
      }
      uVar13 = uVar13 + 1;
    } while ((uVar20 & 0x7fffffff) != uVar13);
    iVar15 = this->rowLength;
  }
  local_80 = uVar21;
  if (1 < iVar15) {
    lVar7 = (long)(int)uVar20;
    lVar11 = lVar7 * (long)(ulong)(iVar15 - 2);
    lVar6 = lVar7 + lVar11;
    pcVar17 = (char *)(ulong)(iVar15 - 2);
LAB_002f9235:
    if (0 < (int)uVar20) {
      uVar13 = 0;
      uVar21 = 0;
      do {
        if (((local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar21 + lVar11] != -1) &&
            (local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar21 + lVar6] != -1)) &&
           (local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar21 + lVar11] !=
            local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar21 + lVar6])) {
          if (uVar20 != (uint)uVar21) {
            lVar23 = uVar13 << 0x20;
            lVar14 = uVar13 + 1;
            goto LAB_002f92e7;
          }
          break;
        }
        uVar21 = uVar21 + 1;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while ((uVar20 & 0x7fffffff) != uVar21);
      if (0 < (int)uVar20) {
        uVar21 = 0;
        do {
          cVar4 = local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar21 + lVar11];
          local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar21 + lVar11] =
               (cVar4 == -1 &
               local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21 + lVar6]) + cVar4 + (cVar4 == -1);
          uVar21 = uVar21 + 1;
        } while ((uVar20 & 0x7fffffff) != uVar21);
      }
    }
    goto LAB_002f92b2;
  }
  goto LAB_002f90f0;
LAB_002f92e7:
  local_78 = pcVar17;
  if ((local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
       super__Vector_impl_data._M_start[lVar14 + lVar11 + -1] != '\0') &&
     (local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar14 + lVar6 + -1] != '\x01')) goto LAB_002f9304;
  lVar23 = lVar23 + -0x100000000;
  lVar25 = lVar14 + -1;
  bVar2 = lVar14 < 1;
  lVar14 = lVar25;
  if (lVar25 == 0 || bVar2) goto LAB_002f94fc;
  goto LAB_002f92e7;
LAB_002f9304:
  if (lVar14 != 1) {
    lVar25 = 0;
    do {
      cVar4 = local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar25 + lVar11];
      local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar25 + lVar11] =
           (cVar4 == -1 &
           local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar25 + lVar6]) + cVar4 + (cVar4 == -1);
      lVar25 = lVar25 + 1;
    } while (lVar25 < lVar23 >> 0x20);
  }
  local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start[(lVar23 >> 0x20) + (long)pcVar17 * lVar7] = '\x01';
  if ((int)lVar14 < (int)uVar20) {
    lVar14 = (long)(int)lVar14;
    do {
      cVar4 = local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14 + lVar11];
      if (local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar14 + lVar11] == -1) {
        cVar4 = '\0';
      }
      local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar14 + lVar11] = cVar4;
      lVar14 = lVar14 + 1;
    } while (lVar14 < lVar7);
  }
LAB_002f92b2:
  lVar6 = lVar6 - lVar7;
  lVar11 = lVar11 - lVar7;
  bVar2 = (long)pcVar17 < 1;
  pcVar17 = pcVar17 + -1;
  if (bVar2) goto LAB_002f9393;
  goto LAB_002f9235;
LAB_002f9478:
  if ((__dest[uVar21 + -local_70 + lVar7] != '\0') && (__dest[uVar21 + lVar7] != '\x01'))
  goto LAB_002f9496;
  iVar9 = iVar9 + -1;
  bVar2 = (long)uVar21 < 1;
  uVar21 = uVar21 - 1;
  if (bVar2) goto LAB_002f94fc;
  goto LAB_002f9478;
LAB_002f9496:
  iVar22 = (int)uVar21;
  if (uVar21 != 0) {
    lVar6 = 0;
    do {
      cVar4 = pcVar16[lVar6];
      pcVar16[lVar6] = (cVar4 == -1 & pcVar19[lVar6]) + cVar4 + (cVar4 == -1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar22);
  }
  __dest[iVar22 + lVar7] = '\0';
  if (iVar22 + 1 < (int)uVar20) {
    lVar6 = (long)iVar9;
    do {
      pcVar16[lVar6] = (pcVar16[lVar6] == -1) * '\x02' + pcVar16[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_70);
  }
LAB_002f944f:
  pcVar18 = pcVar18 + 1;
  pcVar19 = pcVar19 + local_70;
  if (pcVar18 == pcVar17) goto LAB_002f90f0;
  goto LAB_002f93db;
LAB_002f94fc:
  domain->infeasible_ = true;
  domain->infeasible_pos =
       (HighsInt)
       ((ulong)((long)(domain->domchgstack_).
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(domain->domchgstack_).
                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 4);
  (domain->infeasible_reason).type = -2;
  (domain->infeasible_reason).index = 0;
  HVar8 = 0;
  local_68 = rows;
  goto LAB_002f9523;
LAB_002f9393:
  iVar15 = this->rowLength;
  pcVar17 = (char *)(long)iVar15;
  local_68 = rows;
  if (1 < (long)pcVar17) {
    local_70 = (long)(int)uVar20;
    local_60 = (ulong)-uVar20;
    pcVar18 = &DAT_00000001;
    pcVar19 = __dest;
    pcVar16 = __dest;
LAB_002f93db:
    pcVar16 = pcVar16 + local_70;
    local_78 = pcVar17;
    if (0 < (int)uVar20) {
      lVar7 = (long)pcVar18 * local_70;
      lVar6 = 0;
      pcVar24 = pcVar16;
      do {
        if (((pcVar24[-local_70] != -1) && (*pcVar24 != -1)) && (pcVar24[-local_70] != *pcVar24)) {
          uVar12 = (uint)lVar6;
          if (-uVar20 != uVar12) {
            iVar9 = 1 - uVar12;
            uVar21 = (ulong)-uVar12;
            goto LAB_002f9478;
          }
          break;
        }
        lVar6 = lVar6 + -1;
        pcVar24 = pcVar24 + 1;
      } while (-lVar6 != (ulong)(uVar20 & 0x7fffffff));
      if (0 < (int)uVar20) {
        uVar21 = 0;
        do {
          cVar4 = pcVar16[uVar21];
          pcVar16[uVar21] = (cVar4 == -1 & pcVar19[uVar21]) + cVar4 + (cVar4 == -1);
          uVar21 = uVar21 + 1;
        } while ((uVar20 & 0x7fffffff) != uVar21);
      }
    }
    goto LAB_002f944f;
  }
LAB_002f90f0:
  if (iVar15 < 1) {
    bVar5 = domain->infeasible_;
    HVar8 = 0;
  }
  else {
    local_40 = (long)(int)uVar20;
    uVar21 = 0;
    lVar6 = 0;
    HVar8 = 0;
    pcVar17 = __dest;
    local_68 = rows;
    do {
      pcVar3 = local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_60 = uVar21;
      local_38 = lVar6;
      if (0 < (int)local_80) {
        lVar6 = (long)(int)lVar6;
        uVar13 = 0;
        local_78 = pcVar17;
        local_70 = lVar6;
        do {
          cVar4 = pcVar3[uVar13 + uVar21];
          if (cVar4 != pcVar17[uVar13]) break;
          uVar12 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [this->numRows * lVar6 +
                    (long)(local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar13]];
          dVar26 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar12];
          pdVar1 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + (int)uVar12;
          if ((dVar26 != *pdVar1) || (NAN(dVar26) || NAN(*pdVar1))) {
            dVar26 = 1.0;
            if (cVar4 != '\x01') {
              dVar26 = 0.0;
            }
            uVar10 = (ulong)uVar12 + 0x100000000;
            if (cVar4 == '\x01') {
              uVar10 = (ulong)uVar12;
            }
            boundchg.column = (int)uVar10;
            boundchg.boundtype = (int)(uVar10 >> 0x20);
            boundchg.boundval = dVar26;
            HighsDomain::changeBound(domain,boundchg,(Reason)0xfffffffe);
            HVar8 = HVar8 + 1;
            lVar6 = local_70;
            pcVar17 = local_78;
            if (domain->infeasible_ != false) break;
          }
          uVar13 = uVar13 + 1;
        } while ((uVar20 & 0x7fffffff) != uVar13);
      }
      bVar5 = domain->infeasible_;
      if ((bool)bVar5 == true) break;
      lVar6 = local_38 + 1;
      pcVar17 = pcVar17 + local_40;
      uVar21 = local_60 + local_40;
    } while (lVar6 < this->rowLength);
  }
  if ((bVar5 & 1) == 0) {
    HighsDomain::propagate(domain);
  }
LAB_002f9523:
  if (__dest != (char *)0x0) {
    operator_delete(__dest);
  }
  if (local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar8;
}

Assistant:

HighsInt HighsOrbitopeMatrix::orbitalFixingForFullOrbitope(
    const std::vector<HighsInt>& rows, HighsDomain& domain) const {
  HighsInt numDynamicRows = rows.size();
  std::vector<int8_t> Mminimal(numDynamicRows * rowLength, -1);

  for (HighsInt j = 0; j < rowLength; ++j) {
    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      HighsInt r = rows[i];
      HighsInt colij = matrix[r + j * numRows];
      if (domain.col_lower_[colij] == 1.0)
        Mminimal[i + j * numDynamicRows] = 1;
      else if (domain.col_upper_[colij] == 0.0)
        Mminimal[i + j * numDynamicRows] = 0;
    }
  }

  std::vector<int8_t> Mmaximal = Mminimal;

  int8_t* MminimaljLast = Mminimal.data() + numDynamicRows * (rowLength - 1);
  int8_t* MmaximaljFirst = Mmaximal.data();
  for (HighsInt k = 0; k < numDynamicRows; ++k) {
    if (MminimaljLast[k] == -1) MminimaljLast[k] = 0;
    if (MmaximaljFirst[k] == -1) MmaximaljFirst[k] = 1;
  }

  auto i_fixed = [&](const int8_t* colj0, const int8_t* colj1) {
    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      if (colj0[i] != -1 && colj1[i] != -1 && colj0[i] != colj1[i]) return i;
    }

    return numDynamicRows;
  };

  auto i_discr = [&](const int8_t* colj0, const int8_t* colj1, HighsInt i_f) {
    for (HighsInt i = i_f; i >= 0; --i) {
      if (colj0[i] != 0 && colj1[i] != 1) return i;
    }

    return HighsInt{-1};
  };

  for (HighsInt j = rowLength - 2; j >= 0; --j) {
    int8_t* colj0 = Mminimal.data() + j * numDynamicRows;
    int8_t* colj1 = colj0 + numDynamicRows;
    HighsInt i_f = i_fixed(colj0, colj1);

    if (i_f == numDynamicRows) {
      for (HighsInt k = 0; k < numDynamicRows; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
    } else {
      HighsInt i_d = i_discr(colj0, colj1, i_f);
      if (i_d == -1) {
        domain.markInfeasible();
        return 0;
      }

      for (HighsInt k = 0; k < i_d; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
      colj0[i_d] = 1;
      for (HighsInt k = i_d + 1; k < numDynamicRows; ++k)
        colj0[k] += (colj0[k] == -1);
    }
  }

  for (HighsInt j = 1; j < rowLength; ++j) {
    int8_t* colj0 = Mmaximal.data() + j * numDynamicRows;
    int8_t* colj1 = colj0 - numDynamicRows;
    HighsInt i_f = i_fixed(colj1, colj0);

    if (i_f == numDynamicRows) {
      for (HighsInt k = 0; k < numDynamicRows; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
    } else {
      HighsInt i_d = i_discr(colj1, colj0, i_f);
      if (i_d == -1) {
        domain.markInfeasible();
        return 0;
      }
      for (HighsInt k = 0; k < i_d; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
      colj0[i_d] = 0;
      for (HighsInt k = i_d + 1; k < numDynamicRows; ++k)
        colj0[k] += 2 * (colj0[k] == -1);
    }
  }

  HighsInt numFixed = 0;

  for (HighsInt j = 0; j < rowLength; ++j) {
    const int8_t* colMaximal = Mmaximal.data() + j * numDynamicRows;
    const int8_t* colMinimal = Mminimal.data() + j * numDynamicRows;

    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      if (colMinimal[i] != colMaximal[i]) {
        assert(colMinimal[i] < colMaximal[i]);
        break;
      }

      HighsInt r = rows[i];
      HighsInt colrj = matrix[r + j * numRows];
      if (domain.isFixed(colrj)) continue;

      ++numFixed;
      if (colMinimal[i] == 1)
        domain.changeBound(HighsBoundType::kLower, colrj, 1.0,
                           HighsDomain::Reason::unspecified());
      else
        domain.changeBound(HighsBoundType::kUpper, colrj, 0.0,
                           HighsDomain::Reason::unspecified());
      if (domain.infeasible()) break;
    }
    if (domain.infeasible()) break;
  }

  if (!domain.infeasible()) domain.propagate();

  return numFixed;
}